

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_opengl.h
# Opt level: O0

void djgt__set_glpps(GLint *state)

{
  GLint *state_local;
  
  (*glad_glBindBuffer)(0x88eb,*state);
  (*glad_glPixelStorei)(0xd00,state[1]);
  (*glad_glPixelStorei)(0xd01,state[2]);
  (*glad_glPixelStorei)(0xd02,state[3]);
  (*glad_glPixelStorei)(0x806c,state[4]);
  (*glad_glPixelStorei)(0xd03,state[5]);
  (*glad_glPixelStorei)(0xd04,state[6]);
  (*glad_glPixelStorei)(0x806b,state[7]);
  (*glad_glPixelStorei)(0xd05,state[8]);
  return;
}

Assistant:

static void djgt__set_glpps(const djgt__glpss state)
{
    glBindBuffer(GL_PIXEL_PACK_BUFFER , state[0]);
    glPixelStorei(GL_PACK_SWAP_BYTES  , state[1]);
    glPixelStorei(GL_PACK_LSB_FIRST   , state[2]);
    glPixelStorei(GL_PACK_ROW_LENGTH  , state[3]);
    glPixelStorei(GL_PACK_IMAGE_HEIGHT, state[4]);
    glPixelStorei(GL_PACK_SKIP_ROWS   , state[5]);
    glPixelStorei(GL_PACK_SKIP_PIXELS , state[6]);
    glPixelStorei(GL_PACK_SKIP_IMAGES , state[7]);
    glPixelStorei(GL_PACK_ALIGNMENT   , state[8]);
}